

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.hpp
# Opt level: O1

idx_t duckdb::UncompressedStringStorage::StringAppendBase
                (BufferHandle *handle,ColumnSegment *segment,SegmentStatistics *stats,
                UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  atomic<unsigned_long> *paVar1;
  uint *puVar2;
  __int_type _Var3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  BlockManager *pBVar7;
  optional_ptr<duckdb::FileBuffer,_true> *poVar8;
  uint uVar9;
  int iVar10;
  BlockHandle *pBVar11;
  idx_t iVar12;
  idx_t iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  block_id_t *pbVar17;
  ulong uVar18;
  ulong uVar19;
  anon_union_16_2_67f50693_for_value *value;
  char *__src;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  int32_t current_offset;
  block_id_t block;
  int32_t local_94;
  idx_t local_90;
  data_ptr_t local_88;
  ulong local_80;
  __int_type local_78;
  ulong local_70;
  shared_ptr<duckdb::BlockHandle,_true> *local_68;
  BaseStatistics *local_60;
  optional_ptr<duckdb::FileBuffer,_true> *local_58;
  idx_t local_50;
  long local_48;
  ulong local_40;
  block_id_t local_38;
  
  local_58 = &handle->node;
  local_60 = &stats->statistics;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_58);
  puVar2 = (uint *)((handle->node).ptr)->buffer;
  local_88 = data->data;
  local_40 = RemainingSpace(segment,handle);
  _Var3 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  bVar22 = count != 0;
  if (bVar22) {
    local_68 = &segment->block;
    local_48 = offset * 4;
    uVar20 = 1;
    local_78 = _Var3;
    do {
      poVar8 = local_58;
      psVar4 = data->sel->sel_vector;
      if (psVar4 == (sel_t *)0x0) {
        uVar19 = (uVar20 + offset) - 1;
      }
      else {
        uVar19 = (ulong)*(uint *)((long)psVar4 + uVar20 * 4 + local_48 + -4);
      }
      local_50 = uVar20 - 1;
      if (local_40 < 4) {
        LOCK();
        paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + local_50;
        UNLOCK();
        bVar23 = true;
        local_90 = local_50;
      }
      else {
        puVar5 = (data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0))
        {
          local_70 = local_40;
          local_40 = local_40 - 4;
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_58);
          uVar9 = puVar2[1];
          pdVar6 = poVar8->ptr->buffer;
          uVar21 = (ulong)*(uint *)(local_88 + uVar19 * 0x10);
          pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(local_68);
          pBVar7 = pBVar11->block_manager;
          iVar12 = optional_idx::GetIndex(&pBVar7->block_alloc_size);
          iVar13 = optional_idx::GetIndex(&pBVar7->block_header_size);
          uVar14 = iVar12 - iVar13 >> 2 & 0xfffffffffffffff8;
          if (0xfff < uVar14) {
            uVar14 = 0x1000;
          }
          uVar16 = uVar21;
          if (uVar14 <= uVar21) {
            uVar16 = 0xc;
          }
          uVar18 = local_40 - uVar16;
          local_80 = uVar21;
          if (local_40 < uVar16) {
            local_90 = local_50;
            LOCK();
            paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i + local_50;
            UNLOCK();
            bVar23 = true;
          }
          else {
            value = (anon_union_16_2_67f50693_for_value *)(local_88 + uVar19 * 0x10);
            StringStats::Update(local_60,(string_t *)&value->pointer);
            if (local_80 < uVar14) {
              uVar15 = (int)uVar16 + *puVar2;
              *puVar2 = uVar15;
              if ((value->pointer).length < 0xd) {
                __src = (value->pointer).prefix;
              }
              else {
                __src = (value->pointer).ptr;
              }
              switchD_00b1422a::default(pdVar6 + ((ulong)uVar9 - (ulong)uVar15),__src,local_80);
              uVar9 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar2);
            }
            else {
              WriteString(segment,(string_t)value->pointer,&local_38,&local_94);
              uVar15 = *puVar2;
              *puVar2 = uVar15 + 0xc;
              uVar18 = local_70 - 0x10;
              pbVar17 = (block_id_t *)(pdVar6 + ((ulong)uVar9 - (ulong)(uVar15 + 0xc)));
              *pbVar17 = local_38;
              *(int32_t *)(pbVar17 + 1) = local_94;
              iVar10 = NumericCastImpl<int,_unsigned_int,_false>::Convert(*puVar2);
              uVar9 = -iVar10;
            }
            puVar2[_Var3 + uVar20 + 1] = uVar9;
            bVar23 = false;
            local_40 = uVar18;
          }
        }
        else {
          if (local_78 + uVar20 == 1) {
            puVar2[2] = 0;
          }
          else {
            puVar2[_Var3 + uVar20 + 1] = puVar2[_Var3 + uVar20];
          }
          bVar23 = false;
          local_40 = local_40 - 4;
        }
      }
      if (bVar23) break;
      bVar22 = uVar20 < count;
      bVar23 = uVar20 != count;
      uVar20 = uVar20 + 1;
    } while (bVar23);
  }
  if (!bVar22) {
    LOCK();
    paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
    UNLOCK();
    local_90 = count;
  }
  return local_90;
}

Assistant:

static idx_t StringAppendBase(BufferHandle &handle, ColumnSegment &segment, SegmentStatistics &stats,
	                              UnifiedVectorFormat &data, idx_t offset, idx_t count) {
		D_ASSERT(segment.GetBlockOffset() == 0);
		auto handle_ptr = handle.Ptr();
		auto source_data = UnifiedVectorFormat::GetData<string_t>(data);
		auto result_data = reinterpret_cast<int32_t *>(handle_ptr + DICTIONARY_HEADER_SIZE);
		auto dictionary_size = reinterpret_cast<uint32_t *>(handle_ptr);
		auto dictionary_end = reinterpret_cast<uint32_t *>(handle_ptr + sizeof(uint32_t));

		idx_t remaining_space = RemainingSpace(segment, handle);
		auto base_count = segment.count.load();
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = data.sel->get_index(offset + i);
			auto target_idx = base_count + i;
			if (remaining_space < sizeof(int32_t)) {
				// string index does not fit in the block at all
				segment.count += i;
				return i;
			}
			remaining_space -= sizeof(int32_t);
			if (!data.validity.RowIsValid(source_idx)) {
				// null value is stored as a copy of the last value, this is done to be able to efficiently do the
				// string_length calculation
				if (target_idx > 0) {
					result_data[target_idx] = result_data[target_idx - 1];
				} else {
					result_data[target_idx] = 0;
				}
				continue;
			}
			auto end = handle.Ptr() + *dictionary_end;

#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
			// Unknown string, continue
			// non-null value, check if we can fit it within the block
			idx_t string_length = source_data[source_idx].GetSize();

			// determine whether or not we have space in the block for this string
			bool use_overflow_block = false;
			idx_t required_space = string_length;
			if (DUCKDB_UNLIKELY(required_space >=
			                    StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize()))) {
				// string exceeds block limit, store in overflow block and only write a marker here
				required_space = BIG_STRING_MARKER_SIZE;
				use_overflow_block = true;
			}
			if (DUCKDB_UNLIKELY(required_space > remaining_space)) {
				// no space remaining: return how many tuples we ended up writing
				segment.count += i;
				return i;
			}

			// we have space: write the string
			UpdateStringStats(stats, source_data[source_idx]);

			if (DUCKDB_UNLIKELY(use_overflow_block)) {
				// write to overflow blocks
				block_id_t block;
				int32_t current_offset;
				// write the string into the current string block
				WriteString(segment, source_data[source_idx], block, current_offset);
				*dictionary_size += BIG_STRING_MARKER_SIZE;
				remaining_space -= BIG_STRING_MARKER_SIZE;
				auto dict_pos = end - *dictionary_size;

				// write a big string marker into the dictionary
				WriteStringMarker(dict_pos, block, current_offset);

				// place the dictionary offset into the set of vectors
				// note: for overflow strings we write negative value

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				result_data[target_idx] = -NumericCast<int32_t>((*dictionary_size));
			} else {
				// string fits in block, append to dictionary and increment dictionary position
				D_ASSERT(string_length < NumericLimits<uint16_t>::Maximum());
				*dictionary_size += required_space;
				remaining_space -= required_space;
				auto dict_pos = end - *dictionary_size;
				// now write the actual string data into the dictionary
				memcpy(dict_pos, source_data[source_idx].GetData(), string_length);

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				// Place the dictionary offset into the set of vectors.
				result_data[target_idx] = NumericCast<int32_t>(*dictionary_size);
			}
			D_ASSERT(RemainingSpace(segment, handle) <= segment.GetBlockManager().GetBlockSize());
#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
		}
		segment.count += count;
		return count;
	}